

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_pthreads.c
# Opt level: O0

LOCK_RESULT Unlock(LOCK_HANDLE handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  int return_code;
  LOGGER_LOG l;
  LOCK_RESULT result;
  LOCK_HANDLE handle_local;
  
  if (handle == (LOCK_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/lock_pthreads.c"
                ,"Unlock",0x41,1,"Invalid argument; handle is NULL.");
    }
    l._4_4_ = LOCK_ERROR;
  }
  else {
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)handle);
    if (iVar1 == 0) {
      l._4_4_ = LOCK_OK;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/lock_pthreads.c"
                  ,"Unlock",0x4f,1,"pthread_mutex_unlock failed (%d).",iVar1);
      }
      l._4_4_ = LOCK_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

LOCK_RESULT Unlock(LOCK_HANDLE handle)
{
    LOCK_RESULT result;
    if (handle == NULL)
    {
        /* Codes_SRS_LOCK_10_007: [Unlock on NULL handle passed returns LOCK_ERROR] */
        LogError("Invalid argument; handle is NULL.");
        result = LOCK_ERROR;
    }
    else
    {
        int return_code = pthread_mutex_unlock((pthread_mutex_t*)handle);
        if (return_code == 0)
        {
            /* Codes_SRS_LOCK_10_009: [Unlock on success shall return LOCK_OK] */
            result = LOCK_OK;
        }
        else
        {
            /* Codes_SRS_LOCK_10_010: [Unlock on error shall return LOCK_ERROR] */
            LogError("pthread_mutex_unlock failed (%d).", return_code);
            result = LOCK_ERROR;
        }
    }

    return result;
}